

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O2

bool __thiscall
Kernel::MatchingUtils::
matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
          (MatchingUtils *this,TermList base,TermList instance,Binder *binder)

{
  bool bVar1;
  int iVar2;
  
  if (((ulong)this & 3) != 0) {
    iVar2 = Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::
            Binder::bind((Binder *)instance._content,(int)((ulong)this >> 2),
                         (sockaddr *)base._content,(socklen_t)binder);
    return SUB41(iVar2,0);
  }
  if (((base._content & 3) != 0) || (*(int *)(this + 8) != *(int *)(base._content + 8))) {
    return false;
  }
  if ((((byte)this[0x28] & 8) != 0) && ((*(byte *)(base._content + 0x28) & 8) != 0)) {
    bVar1 = Term::ground((Term *)this);
    if (bVar1) {
      return this == (MatchingUtils *)base._content;
    }
    if (*(uint *)(base._content + 0x10) < *(uint *)(this + 0x10)) {
      return false;
    }
  }
  bVar1 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                    (this,(Term *)base._content,(Term *)instance._content,binder);
  return bVar1;
}

Assistant:

static bool matchTerms(TermList base, TermList instance, Binder& binder)
  {
    if(base.isTerm()) {
      Term* bt=base.term();
      if(!instance.isTerm() || base.term()->functor()!=instance.term()->functor()) {
        return false;
      }
      Term* it=instance.term();
      if(bt->shared() && it->shared()) {
        if(bt->ground()) {
          return bt==it;
        }
        if(bt->weight() > it->weight()) {
          return false;
        }
      }
      ASS_G(base.term()->arity(),0);
      return matchArgs(base.term(), instance.term(), binder);
    } else {
      ASS(base.isOrdinaryVar());
      return binder.bind(base.var(), instance);
    }
  }